

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::AlterForeignKeyInfo::Copy(AlterForeignKeyInfo *this)

{
  AlterInfo *in_RSI;
  AlterEntryData local_80;
  
  AlterInfo::GetAlterEntryData(&local_80,in_RSI);
  make_uniq_base<duckdb::AlterInfo,duckdb::AlterForeignKeyInfo,duckdb::AlterEntryData,std::__cxx11::string_const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<std::__cxx11::string,true>const&,duckdb::vector<duckdb::PhysicalIndex,true>const&,duckdb::vector<duckdb::PhysicalIndex,true>const&,duckdb::AlterForeignKeyType_const&>
            ((duckdb *)this,&local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 1),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)&in_RSI[1].catalog.field_2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)&in_RSI[1].schema._M_string_length,
             (vector<duckdb::PhysicalIndex,_true> *)&in_RSI[1].name,
             (vector<duckdb::PhysicalIndex,_true> *)((long)&in_RSI[1].name.field_2 + 8),
             &in_RSI[2].super_ParseInfo.info_type);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.name._M_dataplus._M_p != &local_80.name.field_2) {
    operator_delete(local_80.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.schema._M_dataplus._M_p != &local_80.schema.field_2) {
    operator_delete(local_80.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.catalog._M_dataplus._M_p != &local_80.catalog.field_2) {
    operator_delete(local_80.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> AlterForeignKeyInfo::Copy() const {
	return make_uniq_base<AlterInfo, AlterForeignKeyInfo>(GetAlterEntryData(), fk_table, pk_columns, fk_columns,
	                                                      pk_keys, fk_keys, type);
}